

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

http_content_type_t get_file_MIME_type(char *filename)

{
  int iVar1;
  char *__s1;
  char *__s2;
  int i;
  long lVar2;
  
  __s1 = strrchr(filename,0x2e);
  if (file_ext[0] != (char *)0x0 && __s1 != (char *)0x0) {
    lVar2 = 0;
    __s2 = file_ext[0];
    do {
      iVar1 = strncmp(__s1,__s2,5);
      if (iVar1 == 0) {
        return (http_content_type_t)lVar2;
      }
      __s2 = file_ext[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (__s2 != (char *)0x0);
  }
  return INVALID_MIME;
}

Assistant:

http_content_type_t get_file_MIME_type(const char* filename)
{
  char *fileExtension;
  if ((fileExtension = strrchr(filename, '.')) == NULL)
    return INVALID_MIME;

  http_content_type_t mime = text_html;

  for (int i = 0; file_ext[i] != NULL; ++i, ++mime)
    if (!(strncmp(fileExtension, file_ext[i], 5)))
      return mime;
  return INVALID_MIME;

}